

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Battle.cpp
# Opt level: O0

void __thiscall Battle::enemyTurn(Battle *this)

{
  bool local_19;
  int local_18;
  int iStack_14;
  bool turnAgain;
  int y;
  int x;
  Battle *this_local;
  
  iStack_14 = 1;
  local_18 = 1;
  local_19 = true;
  _y = this;
  do {
    Player::areaNavigate(this->enemy,&stack0xffffffffffffffec,&local_18);
    Player::attack(this->enemy,this->player,iStack_14,local_18,&local_19);
  } while ((local_19 & 1U) != 0);
  return;
}

Assistant:

void Battle::enemyTurn() {
    int x = 1,y = 1;
    bool turnAgain = true;
    do {
        enemy->areaNavigate(x,y);
        enemy->attack(*player,x,y,turnAgain);
    } while (turnAgain);

}